

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WeakReferenceDictionary.h
# Opt level: O2

int __thiscall
JsUtil::
SplitWeakDictionary<bool,Js::RecyclableObject*,true,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,RecyclerPointerComparer,JsUtil::NoResizeLock,Memory::Recycler>
::FindEntryWithKey<Js::RecyclableObject*>
          (SplitWeakDictionary<bool,Js::RecyclableObject*,true,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,RecyclerPointerComparer,JsUtil::NoResizeLock,Memory::Recycler>
           *this,RecyclableObject **key)

{
  long lVar1;
  long lVar2;
  TBKey key_00;
  uint uVar3;
  type tVar4;
  uint targetBucket;
  uint last;
  uint local_34 [2];
  int i;
  
  lVar1 = *(long *)(this + 8);
  if (lVar1 != 0) {
    targetBucket = SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
                   ::GetBucket((SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
                                *)this,(uint)((ulong)*key >> 3) | 1);
    lVar2 = *(long *)(this + 0x10);
    uVar3 = *(uint *)(lVar1 + (ulong)targetBucket * 4);
    last = 0xffffffff;
    while (local_34[0] = uVar3, -1 < (int)local_34[0]) {
      key_00 = *(TBKey *)(*(long *)(this + 0x18) + (ulong)local_34[0] * 0x10);
      tVar4 = SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
              ::RemoveIfCollected<true>
                        ((SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
                          *)this,key_00,(int *)local_34,last,targetBucket);
      uVar3 = local_34[0];
      if (!tVar4) {
        if (key_00 == *key) {
          return local_34[0];
        }
        uVar3 = *(uint *)(lVar2 + 4 + (long)(int)local_34[0] * 8);
        last = local_34[0];
      }
    }
  }
  return -1;
}

Assistant:

inline int FindEntryWithKey(const LookupType& key)
        {
            int * localBuckets = buckets;
            if (localBuckets != nullptr)
            {
                hash_t hashCode = GetHashCodeWithKey<LookupType>(key);
                uint targetBucket = this->GetBucket(hashCode);
                EntryType * localEntries = entries;
                for (int i = localBuckets[targetBucket], last = -1; i >= 0;)
                {
                    TBKey k = this->GetKey(i);
                    if (this->RemoveIfCollected(k, &i, last, targetBucket))
                    {
                        continue;
                    }
                    if (Comparer<TBKey>::Equals(k, key))
                    {
                        return i;
                    }

                    last = i;
                    i = localEntries[i].next;
                }
            }
            return -1;
        }